

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.h
# Opt level: O1

void __thiscall
libwebm::Webm2Pes::Webm2Pes(Webm2Pes *this,string *input_file,PacketReceiverInterface *packet_sink)

{
  pointer pcVar1;
  
  (this->input_file_name_)._M_dataplus._M_p = (pointer)&(this->input_file_name_).field_2;
  pcVar1 = (input_file->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + input_file->_M_string_length);
  (this->output_file_name_)._M_dataplus._M_p = (pointer)&(this->output_file_name_).field_2;
  (this->output_file_name_)._M_string_length = 0;
  (this->output_file_name_).field_2._M_local_buf[0] = '\0';
  (this->webm_parser_)._M_t.
  super___uniq_ptr_impl<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>._M_t.
  super__Tuple_impl<0UL,_mkvparser::Segment_*,_std::default_delete<mkvparser::Segment>_>.
  super__Head_base<0UL,_mkvparser::Segment_*,_false>._M_head_impl = (Segment *)0x0;
  mkvparser::MkvReader::MkvReader(&this->webm_reader_);
  (this->output_file_)._M_t.super___uniq_ptr_impl<_IO_FILE,_libwebm::FILEDeleter>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_libwebm::FILEDeleter>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)0x0;
  this->video_track_num_ = 0;
  this->timecode_scale_ = 1000000;
  this->packet_sink_ = packet_sink;
  (this->packet_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->packet_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->packet_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->bytes_written_ = 0;
  return;
}

Assistant:

Webm2Pes(const std::string& input_file, PacketReceiverInterface* packet_sink)
      : input_file_name_(input_file), packet_sink_(packet_sink) {}